

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O3

_Bool wc_unescape(char *output,char *wildcard)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  
  bVar2 = *wildcard;
  while (bVar2 != 0) {
    uVar3 = bVar2 - 0x2a;
    if (uVar3 < 0x34) {
      if ((ulong)uVar3 != 0x32) {
        if ((0xa000000200001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
          return false;
        }
        goto LAB_00105546;
      }
      bVar2 = wildcard[1];
      if (bVar2 == 0) break;
      lVar4 = 2;
    }
    else {
LAB_00105546:
      lVar4 = 1;
    }
    if ((byte *)output == (byte *)0x0) {
      output = (char *)0x0;
    }
    else {
      *output = bVar2;
      output = (char *)((byte *)output + 1);
    }
    pbVar1 = (byte *)(wildcard + lVar4);
    wildcard = wildcard + lVar4;
    bVar2 = *pbVar1;
  }
  if ((byte *)output != (byte *)0x0) {
    *output = 0;
  }
  return true;
}

Assistant:

bool wc_unescape(char *output, const char *wildcard)
{
    while (*wildcard) {
        if (*wildcard == '\\') {
            wildcard++;
            /* We are lenient about trailing backslashes in non-wildcards. */
            if (*wildcard) {
                if (output)
                    *output++ = *wildcard;
                wildcard++;
            }
        } else if (*wildcard == '*' || *wildcard == '?' ||
                   *wildcard == '[' || *wildcard == ']') {
            return false;              /* it's a wildcard! */
        } else {
            if (output)
                *output++ = *wildcard;
            wildcard++;
        }
    }
    if (output)
        *output = '\0';
    return true;                       /* it's clean */
}